

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O1

void CVmBifTIO::log_input_event(uint argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  CVmConsoleMain *this;
  vm_val_t *pvVar2;
  int iVar3;
  char *pcVar4;
  ushort *puVar5;
  CVmObjFileName *this_00;
  size_t paramlen;
  vm_val_t *pvVar6;
  vm_val_t ele1;
  vm_val_t ele2;
  char tag [128];
  vm_val_t local_c8;
  vm_val_t local_b8;
  vm_val_t local_a8 [8];
  
  CVmBif::check_argc(argc,1);
  pvVar6 = sp_ + -1;
  iVar3 = vm_val_t::is_listlike(pvVar6);
  if (iVar3 == 0) {
    err_throw(0x900);
  }
  iVar3 = vm_val_t::ll_length(pvVar6);
  if (0 < iVar3) {
    local_a8[0].typ = VM_INT;
    local_a8[0].val.obj = 1;
    vm_val_t::ll_index(pvVar6,&local_c8,local_a8);
    paramlen = 0;
    puVar5 = (ushort *)0x0;
    if (iVar3 != 1) {
      local_a8[0].typ = VM_INT;
      local_a8[0].val.obj = 2;
      vm_val_t::ll_index(pvVar6,&local_b8,local_a8);
      if ((local_b8.typ == VM_OBJ) &&
         (iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[local_b8.val.obj >> 0xc]
                                         [local_b8.val.obj & 0xfff].ptr_ + 8))
                            (G_obj_table_X.pages_[local_b8.val.obj >> 0xc] +
                             (local_b8.val.obj & 0xfff),CVmObjFileName::metaclass_reg_), iVar3 != 0)
         ) {
        this_00 = (CVmObjFileName *)
                  ((long)&G_obj_table_X.pages_[local_b8.val.obj >> 0xc]->ptr_ +
                  (ulong)((local_b8.val.obj & 0xfff) * 0x18));
      }
      else {
        this_00 = (CVmObjFileName *)0x0;
      }
      if (this_00 == (CVmObjFileName *)0x0) {
        puVar5 = (ushort *)vm_val_t::get_as_string(&local_b8);
      }
      else {
        puVar5 = (ushort *)CVmObjFileName::get_path_string(this_00);
      }
      if (puVar5 == (ushort *)0x0) goto LAB_00232dbf;
      paramlen = (size_t)*puVar5;
      puVar5 = puVar5 + 1;
    }
    if ((local_c8.typ == VM_INT) || (iVar3 = vm_val_t::nonint_is_numeric(&local_c8), iVar3 != 0)) {
      this = G_console_X;
      if (local_c8.typ != VM_INT) {
        local_c8.val.intval = vm_val_t::nonint_num_to_int(&local_c8);
      }
      CVmConsole::log_event(&this->super_CVmConsole,local_c8.val.intval,(char *)puVar5,paramlen,1);
    }
    else {
      pcVar4 = vm_val_t::get_as_string(&local_c8);
      pvVar6 = sp_;
      if (pcVar4 == (char *)0x0) goto LAB_00232dbf;
      aVar1._4_4_ = local_c8.val._4_4_;
      aVar1.intval = local_c8.val.obj;
      pvVar2 = sp_ + 1;
      *(ulong *)sp_ = CONCAT44(local_c8._4_4_,local_c8.typ);
      sp_ = pvVar2;
      pvVar6->val = aVar1;
      CVmBif::pop_str_val_ui((char *)local_a8,0x80);
      CVmConsole::log_event
                (&G_console_X->super_CVmConsole,(char *)local_a8,(char *)puVar5,paramlen,1);
    }
    sp_ = sp_ + -1;
    CVmBif::retval_nil();
    return;
  }
LAB_00232dbf:
  err_throw(0x902);
}

Assistant:

void CVmBifTIO::log_input_event(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* retrieve the list */
    const vm_val_t *lst = G_stk->get(0);
    if (!lst->is_listlike(vmg0_))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* make sure we have at least one element */
    int len = lst->ll_length(vmg0_);
    if (len < 1)
        err_throw(VMERR_BAD_VAL_BIF);

    /* retrieve the event type code or tag name from the first element */
    vm_val_t ele1;
    lst->ll_index(vmg_ &ele1, 1);

    /* if there's a second element, retrieve the parameter string */
    const char *param = 0;
    size_t paramlen = 0;
    if (len >= 2)
    {
        /* there's a parameter - retrieve it */
        vm_val_t ele2;
        lst->ll_index(vmg_ &ele2, 2);

        /* 
         *   Get its string value.  If it's a filename object, use the
         *   filename path string. 
         */
        CVmObjFileName *fname_param = vm_val_cast(CVmObjFileName, &ele2);
        if (fname_param != 0)
            param = fname_param->get_path_string();
        else
            param = ele2.get_as_string(vmg0_);

        /* if we didn't get a parameter string value, it's an error */
        if (param == 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* get the parameter length and buffer pointer */
        paramlen = vmb_get_len(param);
        param += VMB_LEN;
    }

    /* log the event, according to the type of the event code */
    if (ele1.is_numeric(vmg0_))
    {
        /* it's an integer event type code - log it */
        G_console->log_event(
            vmg_ ele1.num_to_int(vmg0_), param, paramlen, TRUE);
    }
    else if (ele1.get_as_string(vmg0_) != 0)
    {
        /* it's a string event tag - retrieve it in the UI character set */
        char tag[128];
        G_stk->push(&ele1);
        pop_str_val_ui(vmg_ tag, sizeof(tag));

        /* log the event with the given tag */
        G_console->log_event(vmg_ tag, param, paramlen, TRUE);
    }
    else
    {
        /* other types are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* discard arguments */
    G_stk->discard(1);

    /* no return value */
    retval_nil(vmg0_);
}